

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelBufferDataStoreCase::checkTextureState
          (TextureLevelBufferDataStoreCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  bool bVar1;
  GLuint refValue;
  
  refValue = 0;
  if ((spec->levels).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (spec->levels).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    refValue = (this->super_TextureLevelCase).m_texBuffer;
  }
  bVar1 = verifyTextureLevelParameterEqual
                    (gl,spec->queryTarget,0,0x8c2d,refValue,(this->super_TextureLevelCase).m_type);
  return bVar1;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		bool allOk = true;

		if (spec.levels.empty())
		{
			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, 0, m_type);
		}
		else
		{
			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, m_texBuffer, m_type);
		}

		return allOk;
	}